

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiler.cc
# Opt level: O3

bool __thiscall CpuProfiler::Start(CpuProfiler *this,char *fname,ProfilerOptions *options)

{
  bool bVar1;
  undefined1 local_48 [8];
  ProfileHandlerState prof_handler_state;
  SpinLockHolder cl;
  Options collector_options;
  
  LOCK();
  bVar1 = (this->lock_).lockword_.super___atomic_base<int>._M_i == 0;
  if (bVar1) {
    (this->lock_).lockword_.super___atomic_base<int>._M_i = 1;
  }
  UNLOCK();
  prof_handler_state._16_8_ = this;
  if (!bVar1) {
    SpinLock::SlowLock(&this->lock_);
  }
  if ((this->collector_).out_ < 0) {
    ProfileHandlerGetState((ProfileHandlerState *)local_48);
    ProfileData::Options::Options((Options *)((long)&cl.lock_ + 4));
    cl.lock_._4_4_ = local_48._0_4_;
    bVar1 = ProfileData::Start(&this->collector_,fname,(Options *)((long)&cl.lock_ + 4));
    if (bVar1) {
      this->filter_ = (_func_int_void_ptr *)0x0;
      if ((options != (ProfilerOptions *)0x0) &&
         (options->filter_in_thread != (_func_int_void_ptr *)0x0)) {
        this->filter_ = options->filter_in_thread;
        this->filter_arg_ = options->filter_in_thread_arg;
      }
      EnableHandler(this);
    }
  }
  else {
    bVar1 = false;
  }
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&prof_handler_state.allowed);
  return bVar1;
}

Assistant:

bool CpuProfiler::Start(const char* fname, const ProfilerOptions* options) {
  SpinLockHolder cl(&lock_);

  if (collector_.enabled()) {
    return false;
  }

  ProfileHandlerState prof_handler_state;
  ProfileHandlerGetState(&prof_handler_state);

  ProfileData::Options collector_options;
  collector_options.set_frequency(prof_handler_state.frequency);
  if (!collector_.Start(fname, collector_options)) {
    return false;
  }

  filter_ = nullptr;
  if (options != nullptr && options->filter_in_thread != nullptr) {
    filter_ = options->filter_in_thread;
    filter_arg_ = options->filter_in_thread_arg;
  }

  // Setup handler for SIGPROF interrupts
  EnableHandler();

  return true;
}